

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_produce_method(writer *w,MethodDef *method)

{
  bool bVar1;
  anon_class_16_2_3ed68039_conflict2 local_1e8;
  anon_class_8_1_89897ddb_conflict1 local_1d8;
  anon_class_8_1_89897ddb_conflict1 local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  allocator<char> local_1a1;
  undefined1 local_1a0 [8];
  string upcall;
  undefined1 local_170 [8];
  member_value_guard<bool> async_types_guard;
  method_signature signature;
  size_t local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined1 local_28 [8];
  string_view format;
  MethodDef *method_local;
  writer *w_local;
  
  format._M_str = (char *)method;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
  bVar1 = is_noexcept((MethodDef *)format._M_str);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,
               "        int32_t __stdcall %(%) noexcept final\n        {\n%            typename D::abi_guard guard(this->shim());\n            %\n            return 0;\n        }\n"
              );
    local_28 = (undefined1  [8])local_38._M_len;
    format._M_len = (size_t)local_38._M_str;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &signature.m_return.super_row_base<winmd::reader::Param>.m_index,
               "        int32_t __stdcall %(%) noexcept final try\n        {\n%            typename D::abi_guard guard(this->shim());\n            %\n            return 0;\n        }\n        catch (...) { return to_hresult(); }\n"
              );
    local_28 = (undefined1  [8])signature.m_return.super_row_base<winmd::reader::Param>._8_8_;
    format._M_len = local_40;
  }
  method_signature::method_signature
            ((method_signature *)&async_types_guard.previous,(MethodDef *)format._M_str);
  bVar1 = method_signature::is_async((method_signature *)&async_types_guard.previous);
  writer::push_async_types((member_value_guard<bool> *)local_170,w,bVar1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"this->shim().",&local_1a1);
  ::std::allocator<char>::~allocator(&local_1a1);
  local_1b8 = get_name((MethodDef *)format._M_str);
  ::std::__cxx11::string::operator+=((string *)local_1a0,&local_1b8);
  local_1c8 = get_abi_name((MethodDef *)format._M_str);
  local_1d0 = bind<&cppwinrt::write_produce_params,_cppwinrt::method_signature_&>
                        ((method_signature *)&async_types_guard.previous);
  local_1d8 = bind<&cppwinrt::write_produce_cleanup,_cppwinrt::method_signature_&>
                        ((method_signature *)&async_types_guard.previous);
  local_1e8 = bind<&cppwinrt::write_produce_upcall,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cppwinrt::method_signature_&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a0,(method_signature *)&async_types_guard.previous);
  writer_base<cppwinrt::writer>::
  write<std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
            (&w->super_writer_base<cppwinrt::writer>,(string_view *)local_28,&local_1c8,&local_1d0,
             &local_1d8,&local_1e8);
  ::std::__cxx11::string::~string((string *)local_1a0);
  writer::member_value_guard<bool>::~member_value_guard((member_value_guard<bool> *)local_170);
  method_signature::~method_signature((method_signature *)&async_types_guard.previous);
  return;
}

Assistant:

static void write_produce_method(writer& w, MethodDef const& method)
    {
        std::string_view format;

        if (is_noexcept(method))
        {
            format = R"(        int32_t __stdcall %(%) noexcept final
        {
%            typename D::abi_guard guard(this->shim());
            %
            return 0;
        }
)";
        }
        else
        {
            format = R"(        int32_t __stdcall %(%) noexcept final try
        {
%            typename D::abi_guard guard(this->shim());
            %
            return 0;
        }
        catch (...) { return to_hresult(); }
)";
        }

        method_signature signature{ method };
        auto async_types_guard = w.push_async_types(signature.is_async());
        std::string upcall = "this->shim().";
        upcall += get_name(method);

        w.write(format,
            get_abi_name(method),
            bind<write_produce_params>(signature),
            bind<write_produce_cleanup>(signature),
            bind<write_produce_upcall>(upcall, signature));
    }